

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::moveAppend
          (QGenericArrayOps<QFileDialogPrivate::HistoryItem> *this,HistoryItem *b,HistoryItem *e)

{
  HistoryItem *this_00;
  ulong in_RDX;
  ulong in_RSI;
  HistoryItem *in_RDI;
  HistoryItem *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QFileDialogPrivate::HistoryItem>::begin
                        ((QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)0x77e5c7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QFileDialogPrivate::HistoryItem::HistoryItem(this_00,in_RDI);
      local_10 = local_10 + 0x30;
      (in_RDI->path).d.size = (in_RDI->path).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }